

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall mjs::parser::skip_whitespace(parser *this)

{
  token_type tVar1;
  
  do {
    tVar1 = (this->current_token_).type_;
    if (tVar1 != whitespace) {
      if (tVar1 != line_terminator) {
        return;
      }
      this->line_break_skipped_ = true;
    }
    this->token_start_ = (uint32_t)(this->lexer_).text_pos_;
    next_token(this);
  } while( true );
}

Assistant:

void skip_whitespace() {
        for (;; next_token()) {
            if (current_token_type() == token_type::whitespace) {
#ifdef PARSER_DEBUG
                std::wcout << source_extend{source_, token_start_, lexer_.text_position()} << " Consuming token: " << current_token() << "\n";
#endif
            } else if (current_token_type() == token_type::line_terminator) {
                line_break_skipped_ = true;
            } else {
                break;
            }
            token_start_ = lexer_.text_position();
        }
    }